

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::detail::
resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current,
          string_view_type *buffer,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this;
  size_t sVar4;
  to_integer_errc tVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string_view_type *in_RDI;
  type tVar6;
  type result;
  size_t index;
  undefined8 in_stack_ffffffffffffffb8;
  jsonpointer_errc __e;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffff8;
  
  __e = (jsonpointer_errc)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (in_stack_ffffffffffffffc8);
  if (bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
    if ((sVar2 == 1) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](in_RSI,0),
       *pvVar3 == '-')) {
      std::error_code::operator=
                ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),__e);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
      std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
      tVar6 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        ((char *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                         (size_t)in_stack_ffffffffffffffc8,
                         (unsigned_long *)
                         CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0));
      this = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)tVar6.ptr
      ;
      tVar5 = tVar6.ec;
      bVar1 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&stack0xffffffffffffffc8);
      if (bVar1) {
        sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (this);
        if (sVar4 == 0) {
          std::error_code::operator=
                    ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,tVar5),
                     (jsonpointer_errc)((ulong)this >> 0x20));
        }
        else {
          in_RDI = (string_view_type *)
                   basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             (current,(size_t)buffer);
        }
      }
      else {
        std::error_code::operator=
                  ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,tVar5),
                   (jsonpointer_errc)((ulong)this >> 0x20));
      }
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (in_stack_ffffffffffffffc8);
    if (bVar1) {
      bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        (in_stack_fffffffffffffff8,in_RDI);
      if (bVar1) {
        in_RDI = (string_view_type *)
                 basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (in_stack_fffffffffffffff8,in_RDI);
      }
      else {
        std::error_code::operator=
                  ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),__e);
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),__e);
    }
  }
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)in_RDI;
}

Assistant:

const Json* resolve(const Json* current, const typename Json::string_view_type& buffer, std::error_code& ec)
    {
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            std::size_t index{0};
            auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
            if (!result)
            {
                ec = jsonpointer_errc::invalid_index;
                return current;
            }
            if (index >= current->size())
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            current = std::addressof(current->at(index));
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return current;
            }
            current = std::addressof(current->at(buffer));
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return current;
        }
        return current;
    }